

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.h
# Opt level: O0

Analysis __thiscall
spvtools::opt::CopyPropagateArrays::GetPreservedAnalyses(CopyPropagateArrays *this)

{
  Analysis AVar1;
  CopyPropagateArrays *this_local;
  
  AVar1 = opt::operator|(kAnalysisBegin,kAnalysisCFG);
  AVar1 = opt::operator|(AVar1,kAnalysisInstrToBlockMapping);
  AVar1 = opt::operator|(AVar1,kAnalysisLoopAnalysis);
  AVar1 = opt::operator|(AVar1,kAnalysisDecorations);
  AVar1 = opt::operator|(AVar1,kAnalysisDominatorAnalysis);
  AVar1 = opt::operator|(AVar1,kAnalysisNameMap);
  AVar1 = opt::operator|(AVar1,kAnalysisConstants);
  AVar1 = opt::operator|(AVar1,kAnalysisTypes);
  return AVar1;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisDefUse | IRContext::kAnalysisCFG |
           IRContext::kAnalysisInstrToBlockMapping |
           IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisDecorations |
           IRContext::kAnalysisDominatorAnalysis | IRContext::kAnalysisNameMap |
           IRContext::kAnalysisConstants | IRContext::kAnalysisTypes;
  }